

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT3D.c
# Opt level: O0

uint32_t FACT3DCalculate(uint8_t *F3DInstance,F3DAUDIO_LISTENER *pListener,
                        F3DAUDIO_EMITTER *pEmitter,F3DAUDIO_DSP_SETTINGS *pDSPSettings)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  F3DAUDIO_DSP_SETTINGS *in_stack_00000060;
  uint32_t in_stack_0000006c;
  F3DAUDIO_EMITTER *in_stack_00000070;
  F3DAUDIO_LISTENER *in_stack_00000078;
  uint8_t *in_stack_00000080;
  
  if (((in_RSI != 0) && (in_RDX != 0)) && (in_RCX != 0)) {
    if ((1 < *(uint *)(in_RDX + 0x40)) && (*(long *)(in_RDX + 0x48) == 0)) {
      *(undefined4 *)(in_RDX + 0x44) = 0x3f800000;
      if (*(int *)(in_RDX + 0x40) == 2) {
        *(float **)(in_RDX + 0x48) = aStereoLayout;
      }
      else if (*(int *)(in_RDX + 0x40) == 3) {
        *(float **)(in_RDX + 0x48) = a2Point1Layout;
      }
      else if (*(int *)(in_RDX + 0x40) == 4) {
        *(float **)(in_RDX + 0x48) = aQuadLayout;
      }
      else if (*(int *)(in_RDX + 0x40) == 5) {
        *(float **)(in_RDX + 0x48) = a4Point1Layout;
      }
      else if (*(int *)(in_RDX + 0x40) == 6) {
        *(float **)(in_RDX + 0x48) = a5Point1Layout;
      }
      else {
        if (*(int *)(in_RDX + 0x40) != 8) {
          return 0;
        }
        *(float **)(in_RDX + 0x48) = a7Point1Layout;
      }
    }
    if (*(long *)(in_RDX + 0x50) == 0) {
      *(F3DAUDIO_DISTANCE_CURVE **)(in_RDX + 0x50) = &FACT3DCalculate::DefaultCurve;
    }
    if (*(long *)(in_RDX + 0x58) == 0) {
      *(F3DAUDIO_DISTANCE_CURVE **)(in_RDX + 0x58) = &FACT3DCalculate::DefaultCurve;
    }
    F3DAudioCalculate(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006c,
                      in_stack_00000060);
  }
  return 0;
}

Assistant:

uint32_t FACT3DCalculate(
	F3DAUDIO_HANDLE F3DInstance,
	const F3DAUDIO_LISTENER *pListener,
	F3DAUDIO_EMITTER *pEmitter,
	F3DAUDIO_DSP_SETTINGS *pDSPSettings
) {
	static F3DAUDIO_DISTANCE_CURVE_POINT DefaultCurvePoints[2] =
	{
		{ 0.0f, 1.0f },
		{ 1.0f, 1.0f }
	};
	static F3DAUDIO_DISTANCE_CURVE DefaultCurve =
	{
		(F3DAUDIO_DISTANCE_CURVE_POINT*) &DefaultCurvePoints[0], 2
	};

	if (pListener == NULL || pEmitter == NULL || pDSPSettings == NULL)
	{
		return 0;
	}

	if (pEmitter->ChannelCount > 1 && pEmitter->pChannelAzimuths == NULL)
	{
		pEmitter->ChannelRadius = 1.0f;

		if (pEmitter->ChannelCount == 2)
		{
			pEmitter->pChannelAzimuths = (float*) &aStereoLayout[0];
		}
		else if (pEmitter->ChannelCount == 3)
		{
			pEmitter->pChannelAzimuths = (float*) &a2Point1Layout[0];
		}
		else if (pEmitter->ChannelCount == 4)
		{
			pEmitter->pChannelAzimuths = (float*) &aQuadLayout[0];
		}
		else if (pEmitter->ChannelCount == 5)
		{
			pEmitter->pChannelAzimuths = (float*) &a4Point1Layout[0];
		}
		else if (pEmitter->ChannelCount == 6)
		{
			pEmitter->pChannelAzimuths = (float*) &a5Point1Layout[0];
		}
		else if (pEmitter->ChannelCount == 8)
		{
			pEmitter->pChannelAzimuths = (float*) &a7Point1Layout[0];
		}
		else
		{
			return 0;
		}
	}

	if (pEmitter->pVolumeCurve == NULL)
	{
		pEmitter->pVolumeCurve = &DefaultCurve;
	}
	if (pEmitter->pLFECurve == NULL)
	{
		pEmitter->pLFECurve = &DefaultCurve;
	}

	F3DAudioCalculate(
		F3DInstance,
		pListener,
		pEmitter,
		(
			F3DAUDIO_CALCULATE_MATRIX |
			F3DAUDIO_CALCULATE_DOPPLER |
			F3DAUDIO_CALCULATE_EMITTER_ANGLE
		),
		pDSPSettings
	);
	return 0;
}